

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O0

uint __thiscall
EnvironmentROBARM::GetHeurBasedonCoord(EnvironmentROBARM *this,unsigned_short *coord)

{
  undefined8 in_RSI;
  long *in_RDI;
  uint h;
  double angles [6];
  unsigned_short endeffy;
  unsigned_short endeffx;
  undefined1 local_48 [52];
  undefined1 local_14 [2];
  undefined1 local_12 [18];
  
  (**(code **)(*in_RDI + 0xe0))(in_RDI,in_RSI,local_48);
  (**(code **)(*in_RDI + 0xf0))(in_RDI,local_48,local_12,local_14);
  return 0;
}

Assistant:

unsigned int EnvironmentROBARM::GetHeurBasedonCoord(short unsigned int coord[NUMOFLINKS])
{
    short unsigned int endeffx, endeffy;
    double angles[NUMOFLINKS];
    unsigned int h;

    ComputeContAngles(coord, angles);
    ComputeEndEffectorPos(angles, &endeffx, &endeffy);

#if INFORMED
    h = HeurGrid[endeffx][endeffy];
#else
    h = 0;
#endif

    return h;
}